

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void slang::ast::AssertionPortSymbol::buildPorts
               (Scope *scope,AssertionItemPortListSyntax *syntax,
               SmallVectorBase<const_slang::ast::AssertionPortSymbol_*> *results)

{
  SyntaxKind SVar1;
  SyntaxNode *pSVar2;
  DataTypeSyntax *syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  SourceLocation SVar3;
  Type *arg;
  bool bVar4;
  ArgumentDirection AVar5;
  AssertionItemPortSyntax *pAVar6;
  _Optional_payload_base<slang::ast::ArgumentDirection> _Var7;
  Diagnostic *pDVar8;
  ulong uVar9;
  SyntaxNode *this;
  _Optional_payload_base<slang::ast::ArgumentDirection> _Var10;
  string_view arg_00;
  SourceRange SVar11;
  AssertionPortSymbol *port;
  const_iterator __begin2;
  SourceLocation local_90;
  SymbolKind local_84;
  Scope *local_80;
  Token local_78;
  iterator_base<const_slang::syntax::AssertionItemPortSyntax_*> local_68;
  Type *local_58;
  ulong local_50;
  Compilation *local_48;
  SmallVectorBase<const_slang::ast::AssertionPortSymbol_*> *local_40;
  ParentList *local_38;
  
  local_48 = scope->compilation;
  local_84 = scope->thisSym->kind;
  local_40 = results;
  local_58 = Compilation::getType(local_48,Untyped);
  local_68.list = &syntax->ports;
  local_68.index = 0;
  local_50 = (syntax->ports).elements._M_extent._M_extent_value + 1 >> 1;
  _Var10._M_payload = (_Storage<slang::ast::ArgumentDirection,_true>)0x0;
  _Var10._M_engaged = false;
  _Var10._5_3_ = 0;
  uVar9 = 0;
  this = (SyntaxNode *)0x0;
  local_80 = scope;
  local_38 = local_68.list;
  for (; (local_68.list != local_38 || (local_68.index != local_50));
      local_68.index = local_68.index + 1) {
    pAVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::
             iterator_base<const_slang::syntax::AssertionItemPortSyntax_*>::dereference(&local_68);
    pSVar2 = (pAVar6->super_SyntaxNode).previewNode;
    if (pSVar2 != (SyntaxNode *)0x0) {
      Scope::addMembers(scope,pSVar2);
    }
    local_78 = (Token)parsing::Token::valueText(&pAVar6->name);
    local_90 = parsing::Token::location(&pAVar6->name);
    local_90 = (SourceLocation)
               BumpAllocator::
               emplace<slang::ast::AssertionPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                         (&local_48->super_BumpAllocator,
                          (basic_string_view<char,_std::char_traits<char>_> *)&local_78,&local_90);
    *(AssertionItemPortSyntax **)((long)local_90 + 0x38) = pAVar6;
    syntax_01._M_ptr =
         (pAVar6->attributes).
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_01._M_extent._M_extent_value =
         (pAVar6->attributes).
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes((Symbol *)local_90,scope,syntax_01);
    if ((pAVar6->dimensions).
        super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
        _M_extent_value != 0) {
      DeclaredType::setDimensionSyntax((DeclaredType *)((long)local_90 + 0x40),&pAVar6->dimensions);
    }
    if ((pAVar6->local).info == (Info *)0x0) {
      bVar4 = isEmptyType((pAVar6->type).ptr);
      if (bVar4) {
        (((optional<slang::ast::ArgumentDirection> *)((long)local_90 + 0x88))->
        super__Optional_base<slang::ast::ArgumentDirection,_true,_true>)._M_payload.
        super__Optional_payload_base<slang::ast::ArgumentDirection> =
             (_Optional_payload_base<slang::ast::ArgumentDirection>)
             ((ulong)_Var10 & 0xffffffffff | uVar9);
      }
    }
    else {
      _Var7._M_payload = (_Storage<slang::ast::ArgumentDirection,_true>)0x0;
      _Var7._M_engaged = true;
      _Var7._5_3_ = 0;
      if ((pAVar6->direction).info != (Info *)0x0) {
        AVar5 = SemanticFacts::getDirection((pAVar6->direction).kind);
        _Var7 = (_Optional_payload_base<slang::ast::ArgumentDirection>)((ulong)AVar5 | 0x100000000);
      }
      *(_Optional_payload_base<slang::ast::ArgumentDirection> *)((long)local_90 + 0x88) = _Var7;
      this = (SyntaxNode *)0x0;
    }
    SVar3 = local_90;
    if (*(bool *)((long)local_90 + 0x8c) == true) {
      *(byte *)((long)local_90 + 0x79) = *(byte *)((long)local_90 + 0x79) | 0x20;
    }
    syntax_00 = (pAVar6->type).ptr;
    bVar4 = isEmptyType(syntax_00);
    arg = local_58;
    scope = local_80;
    if (bVar4) {
      if (this == (SyntaxNode *)0x0) {
        *(Type **)((long)SVar3 + 0x48) = local_58;
        if ((pAVar6->dimensions).
            super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
            _M_extent_value != 0) {
          SVar11 = slang::syntax::SyntaxNode::sourceRange
                             (&(pAVar6->dimensions).super_SyntaxListBase.super_SyntaxNode);
          pDVar8 = Scope::addDiag(scope,(DiagCode)0xb0009,SVar11);
          ast::operator<<(pDVar8,arg);
        }
        if ((pAVar6->local).info != (Info *)0x0 && local_84 != LetDecl) {
          SVar11 = parsing::Token::range(&pAVar6->local);
          Scope::addDiag(scope,(DiagCode)0x6b0006,SVar11);
        }
        this = (SyntaxNode *)0x0;
      }
      else {
        ((anon_union_8_2_f12d5f64_for_typeOrLink *)((long)SVar3 + 0x50))->typeSyntax =
             (DataTypeSyntax *)this;
        *(byte *)((long)SVar3 + 0x7f) = *(byte *)((long)SVar3 + 0x7f) & 0x7f;
      }
    }
    else {
      ((anon_union_8_2_f12d5f64_for_typeOrLink *)((long)SVar3 + 0x50))->typeSyntax = syntax_00;
      *(byte *)((long)SVar3 + 0x7f) = *(byte *)((long)SVar3 + 0x7f) & 0x7f;
      this = (SyntaxNode *)(pAVar6->type).ptr;
      SVar1 = this->kind;
      if (SVar1 == PropertyType && local_84 == Sequence) {
        SVar11 = slang::syntax::SyntaxNode::sourceRange(this);
        scope = local_80;
        Scope::addDiag(local_80,(DiagCode)0xb10006,SVar11);
      }
      else if ((SVar1 == SequenceType || SVar1 == PropertyType) && local_84 == LetDecl) {
        SVar11 = slang::syntax::SyntaxNode::sourceRange(this);
        pDVar8 = Scope::addDiag(scope,(DiagCode)0xb00006,SVar11);
        local_78 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)(pAVar6->type).ptr);
        arg_00 = parsing::Token::valueText(&local_78);
        Diagnostic::operator<<(pDVar8,arg_00);
      }
    }
    _Var10 = *(_Optional_payload_base<slang::ast::ArgumentDirection> *)((long)local_90 + 0x88);
    if (pAVar6->defaultValue != (EqualsAssertionArgClauseSyntax *)0x0) {
      pSVar2 = &((pAVar6->defaultValue->expr).ptr)->super_SyntaxNode;
      if (_Var10._M_payload._M_value - Out < 2 && ((ulong)_Var10 & 0x100000000) != 0) {
        SVar11 = slang::syntax::SyntaxNode::sourceRange(pSVar2);
        Scope::addDiag(scope,(DiagCode)0x20006,SVar11);
      }
      else {
        *(SyntaxNode **)((long)local_90 + 0x80) = pSVar2;
      }
    }
    uVar9 = (ulong)_Var10 & 0xffffff0000000000;
    Scope::addMember(scope,(Symbol *)local_90);
    SmallVectorBase<slang::ast::AssertionPortSymbol_const*>::
    emplace_back<slang::ast::AssertionPortSymbol_const*const&>
              ((SmallVectorBase<slang::ast::AssertionPortSymbol_const*> *)local_40,
               (AssertionPortSymbol **)&local_90);
  }
  return;
}

Assistant:

void AssertionPortSymbol::buildPorts(Scope& scope, const AssertionItemPortListSyntax& syntax,
                                     SmallVectorBase<const AssertionPortSymbol*>& results) {
    auto& comp = scope.getCompilation();
    auto parentKind = scope.asSymbol().kind;
    auto& untyped = comp.getType(SyntaxKind::Untyped);
    const DataTypeSyntax* lastType = nullptr;
    std::optional<ArgumentDirection> lastDir;

    for (auto item : syntax.ports) {
        if (item->previewNode)
            scope.addMembers(*item->previewNode);

        auto port = comp.emplace<AssertionPortSymbol>(item->name.valueText(),
                                                      item->name.location());
        port->setSyntax(*item);
        port->setAttributes(scope, item->attributes);

        if (!item->dimensions.empty())
            port->declaredType.setDimensionSyntax(item->dimensions);

        if (item->local) {
            port->direction = item->direction ? SemanticFacts::getDirection(item->direction.kind)
                                              : ArgumentDirection::In;

            // If we have a direction we can never inherit the previous type.
            lastType = nullptr;
        }
        else if (isEmptyType(*item->type)) {
            port->direction = lastDir;
        }

        // 'local' direction requires that we have a sequence type. This flag needs to be
        // added prior to setting a resolved type in the branches below.
        if (port->direction)
            port->declaredType.addFlags(DeclaredTypeFlags::RequireSequenceType);

        if (isEmptyType(*item->type)) {
            if (lastType)
                port->declaredType.setTypeSyntax(*lastType);
            else {
                port->declaredType.setType(untyped);
                if (!item->dimensions.empty()) {
                    scope.addDiag(diag::InvalidArrayElemType, item->dimensions.sourceRange())
                        << untyped;
                }

                if (item->local && parentKind != SymbolKind::LetDecl)
                    scope.addDiag(diag::LocalVarTypeRequired, item->local.range());
            }
        }
        else {
            port->declaredType.setTypeSyntax(*item->type);
            lastType = item->type;

            // Ports of type 'property' are not allowed in sequences,
            // and let declarations cannot have ports of type 'sequence' or 'property'.
            auto itemKind = item->type->kind;
            if (itemKind == SyntaxKind::PropertyType && parentKind == SymbolKind::Sequence) {
                scope.addDiag(diag::PropertyPortInSeq, item->type->sourceRange());
            }
            else if ((itemKind == SyntaxKind::PropertyType ||
                      itemKind == SyntaxKind::SequenceType) &&
                     parentKind == SymbolKind::LetDecl) {
                scope.addDiag(diag::PropertyPortInLet, item->type->sourceRange())
                    << item->type->getFirstToken().valueText();
            }
        }

        lastDir = port->direction;
        if (item->defaultValue) {
            if (port->direction == ArgumentDirection::Out ||
                port->direction == ArgumentDirection::InOut) {
                scope.addDiag(diag::AssertionPortOutputDefault,
                              item->defaultValue->expr->sourceRange());
            }
            else {
                port->defaultValueSyntax = item->defaultValue->expr;
            }
        }

        scope.addMember(*port);
        results.push_back(port);
    }
}